

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O3

void Abc_NtkBddImplicationTest(void)

{
  DdNode **ppDVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  DdManager *unique;
  DdNode *pDVar5;
  DdNode *n;
  long lVar6;
  long lVar7;
  DdNode *n_00;
  timespec ts;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar2 = 200;
  unique = Cudd_Init(200,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SIFT);
  n_00 = (DdNode *)((ulong)unique->one ^ 1);
  Cudd_Ref(n_00);
  do {
    putchar(0x2e);
    ppDVar1 = unique->vars;
    iVar3 = rand();
    pDVar5 = ppDVar1[iVar3 % 200];
    ppDVar1 = unique->vars;
    iVar3 = rand();
    pDVar5 = Cudd_bddAnd(unique,pDVar5,ppDVar1[iVar3 % 200]);
    Cudd_Ref(pDVar5);
    n = Cudd_bddOr(unique,n_00,pDVar5);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(unique,n_00);
    Cudd_RecursiveDeref(unique,pDVar5);
    iVar2 = iVar2 + -1;
    n_00 = n;
  } while (iVar2 != 0);
  uVar4 = Cudd_DagSize(n);
  printf("The BDD before = %d.\n",(ulong)uVar4);
  Cudd_ReduceHeap(unique,CUDD_REORDER_SIFT,1);
  uVar4 = Cudd_DagSize(n);
  iVar2 = 0x95ea63;
  printf("The BDD after  = %d.\n",(ulong)uVar4);
  Abc_Print(iVar2,"%s =","Time");
  iVar3 = 3;
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar7 + lVar6) / 1000000.0);
  Cudd_RecursiveDeref(unique,n);
  Cudd_Quit(unique);
  return;
}

Assistant:

void Abc_NtkBddImplicationTest()
{
    DdManager * dd;
    DdNode * bImp, * bSum, * bTemp;
    int nVars = 200;
    int nImps = 200;
    int i;
    abctime clk;
clk = Abc_Clock();
    dd = Cudd_Init( nVars, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd, CUDD_REORDER_SIFT );
    bSum = b0;   Cudd_Ref( bSum );
    for ( i = 0; i < nImps; i++ )
    {
        printf( "." );
        bImp = Cudd_bddAnd( dd, dd->vars[rand()%nVars], dd->vars[rand()%nVars] );  Cudd_Ref( bImp );
        bSum = Cudd_bddOr( dd, bTemp = bSum, bImp );     Cudd_Ref( bSum );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bImp );
    }
    printf( "The BDD before = %d.\n", Cudd_DagSize(bSum) );
    Cudd_ReduceHeap( dd, CUDD_REORDER_SIFT, 1 );
    printf( "The BDD after  = %d.\n", Cudd_DagSize(bSum) );
ABC_PRT( "Time", Abc_Clock() - clk );
    Cudd_RecursiveDeref( dd, bSum );
    Cudd_Quit( dd );
}